

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::LastIndexOfHelper<Js::RecyclableObject>
              (RecyclableObject *pArr,Var search,int64 fromIndex,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  uint64 uVar6;
  uint64 uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint32 i;
  uint uVar11;
  Var index;
  uint32 index_00;
  double value;
  Var local_40;
  Var element;
  
  local_40 = (Var)0x0;
  uVar8 = (ulong)search & 0xffff000000000000;
  if (((ulong)search & 0x1ffff00000000) != 0x1000000000000 && uVar8 == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) {
LAB_00b9ba2a:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  if (0xfffffffe < fromIndex) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      if ((int)fromIndex == fromIndex) {
        index = (Var)(fromIndex & 0xffffffffU | 0x1000000000000);
      }
      else {
        value = (double)fromIndex;
        uVar6 = NumberUtilities::ToSpecial(value);
        bVar2 = NumberUtilities::IsNan(value);
        if (((bVar2) && (uVar7 = NumberUtilities::ToSpecial(value), uVar7 != 0xfff8000000000000)) &&
           (uVar7 = NumberUtilities::ToSpecial(value), uVar7 != 0x7ff8000000000000)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0xa2,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar2) goto LAB_00b9ba2a;
          *puVar5 = 0;
        }
        index = (Var)(uVar6 ^ 0xfffc000000000000);
      }
      BVar4 = JavascriptOperators::OP_HasItem(pArr,index,scriptContext);
      if (BVar4 == 0) {
LAB_00b9b7ce:
        fromIndex = fromIndex - 1;
        bVar2 = false;
      }
      else {
        local_40 = JavascriptOperators::OP_GetElementI(pArr,index,scriptContext);
        if (uVar8 == 0x1000000000000) {
          uVar10 = (ulong)local_40 & 0xffff000000000000;
          if (((ulong)local_40 & 0x1ffff00000000) != 0x1000000000000 && uVar10 == 0x1000000000000) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar5 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                        ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                        "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
            if (!bVar2) goto LAB_00b9ba2a;
            *puVar5 = 0;
          }
          if (uVar10 != 0x1000000000000) goto LAB_00b9b7ae;
          if (local_40 == search) goto LAB_00b9b7c3;
          fromIndex = fromIndex - 1;
          bVar2 = false;
        }
        else {
LAB_00b9b7ae:
          BVar4 = JavascriptOperators::StrictEqual(local_40,search,scriptContext);
          if (BVar4 == 0) goto LAB_00b9b7ce;
LAB_00b9b7c3:
          bVar2 = true;
          element = index;
        }
      }
      if (bVar2) {
        return element;
      }
    } while (0xfffffffe < fromIndex);
  }
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  uVar11 = 0;
  uVar10 = fromIndex & 0xffffffff;
  do {
    index_00 = (uint32)uVar10;
    BVar4 = TemplatedGetItem<Js::RecyclableObject>(pArr,index_00,&local_40,scriptContext,true);
    bVar2 = false;
    if (BVar4 != 0) {
      if (uVar8 == 0x1000000000000) {
        uVar9 = (ulong)local_40 & 0xffff000000000000;
        if (((ulong)local_40 & 0x1ffff00000000) != 0x1000000000000 && uVar9 == 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar3) goto LAB_00b9ba2a;
          *puVar5 = 0;
        }
        if (uVar9 != 0x1000000000000) goto LAB_00b9b8f9;
        if (local_40 != search) goto LAB_00b9b9e4;
        if ((int)index_00 < 0) goto LAB_00b9b93b;
LAB_00b9b915:
        element = (Var)(uVar10 | 0x1000000000000);
      }
      else {
LAB_00b9b8f9:
        BVar4 = JavascriptOperators::StrictEqual(local_40,search,scriptContext);
        if (BVar4 == 0) {
          bVar2 = false;
          goto LAB_00b9b9e4;
        }
        if (-1 < (int)index_00) goto LAB_00b9b915;
LAB_00b9b93b:
        element = (Var)(double)uVar10;
        uVar6 = NumberUtilities::ToSpecial((double)element);
        bVar2 = NumberUtilities::IsNan((double)element);
        if (((bVar2) &&
            (uVar7 = NumberUtilities::ToSpecial((double)element), uVar7 != 0xfff8000000000000)) &&
           (uVar7 = NumberUtilities::ToSpecial((double)element), uVar7 != 0x7ff8000000000000)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0xa2,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar2) goto LAB_00b9ba2a;
          *puVar5 = 0;
        }
        element = (Var)(uVar6 ^ 0xfffc000000000000);
      }
      bVar2 = true;
    }
LAB_00b9b9e4:
    if (bVar2) {
      return element;
    }
    uVar11 = uVar11 + 1;
    uVar10 = (ulong)(index_00 - 1);
    if ((uint)fromIndex < uVar11) {
      return &DAT_10000ffffffff;
    }
  } while( true );
}

Assistant:

Var JavascriptArray::LastIndexOfHelper(T* pArr, Var search, int64 fromIndex, ScriptContext * scriptContext)
    {
        Var element = nullptr;
        bool isSearchTaggedInt = TaggedInt::Is(search);

        // First handle the indices > 2^32
        while (fromIndex >= MaxArrayLength)
        {
            Var index = JavascriptNumber::ToVar(fromIndex, scriptContext);

            if (JavascriptOperators::OP_HasItem(pArr, index, scriptContext))
            {
                element = JavascriptOperators::OP_GetElementI(pArr, index, scriptContext);

                if (isSearchTaggedInt && TaggedInt::Is(element))
                {
                    if (element == search)
                    {
                        return index;
                    }
                    fromIndex--;
                    continue;
                }

                if (JavascriptOperators::StrictEqual(element, search, scriptContext))
                {
                    return index;
                }
            }

            fromIndex--;
        }

        Assert(fromIndex < MaxArrayLength);

        // fromIndex now has to be < MaxArrayLength so casting to uint32 is safe
        uint32 end = static_cast<uint32>(fromIndex);

        for (uint32 i = 0; i <= end; i++)
        {
            uint32 index = end - i;

            if (!TryTemplatedGetItem<T>(pArr, index, &element, scriptContext))
            {
                continue;
            }

            if (isSearchTaggedInt && TaggedInt::Is(element))
            {
                if (element == search)
                {
                    return JavascriptNumber::ToVar(index, scriptContext);
                }
                continue;
            }

            if (JavascriptOperators::StrictEqual(element, search, scriptContext))
            {
                return JavascriptNumber::ToVar(index, scriptContext);
            }
        }

        return TaggedInt::ToVarUnchecked(-1);
    }